

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_ineighbor_alltoallv_
               (void *sendbuf,int *sendcounts,int *sdispls,MPIABI_Fint *senddtype,void *recvbuf,
               int *recvcounts,int *rdispls,MPIABI_Fint *recvtype,MPIABI_Fint *comm,
               MPIABI_Fint *request,MPIABI_Fint *ierror)

{
  int *recvcounts_local;
  void *recvbuf_local;
  MPIABI_Fint *senddtype_local;
  int *sdispls_local;
  int *sendcounts_local;
  void *sendbuf_local;
  
  mpi_ineighbor_alltoallv_
            (sendbuf,sendcounts,sdispls,senddtype,recvbuf,recvcounts,rdispls,recvtype,comm,request,
             ierror);
  return;
}

Assistant:

void mpiabi_ineighbor_alltoallv_(
  const void * sendbuf,
  const int * sendcounts,
  const int * sdispls,
  const MPIABI_Fint * senddtype,
  void * recvbuf,
  const int * recvcounts,
  const int * rdispls,
  const MPIABI_Fint * recvtype,
  const MPIABI_Fint * comm,
  MPIABI_Fint * request,
  MPIABI_Fint * ierror
) {
  return mpi_ineighbor_alltoallv_(
    sendbuf,
    sendcounts,
    sdispls,
    senddtype,
    recvbuf,
    recvcounts,
    rdispls,
    recvtype,
    comm,
    request,
    ierror
  );
}